

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_base.cpp
# Opt level: O0

out_pipe_t * __thiscall
zmq::routing_socket_base_t::lookup_out_pipe(routing_socket_base_t *this,blob_t *routing_id_)

{
  bool bVar1;
  pointer ppVar2;
  const_iterator it;
  map<zmq::blob_t,_zmq::routing_socket_base_t::out_pipe_t,_std::less<zmq::blob_t>,_std::allocator<std::pair<const_zmq::blob_t,_zmq::routing_socket_base_t::out_pipe_t>_>_>
  *in_stack_ffffffffffffffc8;
  out_pipe_t *local_30;
  _Self local_20;
  _Self local_18 [3];
  
  local_18[0]._M_node =
       (_Base_ptr)
       std::
       map<zmq::blob_t,_zmq::routing_socket_base_t::out_pipe_t,_std::less<zmq::blob_t>,_std::allocator<std::pair<const_zmq::blob_t,_zmq::routing_socket_base_t::out_pipe_t>_>_>
       ::find(in_stack_ffffffffffffffc8,(key_type *)0x2d6d49);
  local_20._M_node =
       (_Base_ptr)
       std::
       map<zmq::blob_t,_zmq::routing_socket_base_t::out_pipe_t,_std::less<zmq::blob_t>,_std::allocator<std::pair<const_zmq::blob_t,_zmq::routing_socket_base_t::out_pipe_t>_>_>
       ::end(in_stack_ffffffffffffffc8);
  bVar1 = std::operator==(local_18,&local_20);
  if (bVar1) {
    local_30 = (out_pipe_t *)0x0;
  }
  else {
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_zmq::blob_t,_zmq::routing_socket_base_t::out_pipe_t>_>
             ::operator->((_Rb_tree_const_iterator<std::pair<const_zmq::blob_t,_zmq::routing_socket_base_t::out_pipe_t>_>
                           *)0x2d6d8c);
    local_30 = &ppVar2->second;
  }
  return local_30;
}

Assistant:

const zmq::routing_socket_base_t::out_pipe_t *
zmq::routing_socket_base_t::lookup_out_pipe (const blob_t &routing_id_) const
{
    // TODO we could probably avoid constructor a temporary blob_t to call this function
    const out_pipes_t::const_iterator it = _out_pipes.find (routing_id_);
    return it == _out_pipes.end () ? NULL : &it->second;
}